

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O1

FSerializer * Serialize(FSerializer *arc,char *key,int64_t *value,int64_t *defval)

{
  uint uVar1;
  FWriter *pFVar2;
  char cVar3;
  Value *pVVar4;
  
  pFVar2 = arc->w;
  if (pFVar2 == (FWriter *)0x0) {
    pVVar4 = FReader::FindKey(arc->r,key);
    if (pVVar4 != (Value *)0x0) {
      if ((*(byte *)((long)&pVVar4->data_ + 0x16) & 0x80) == 0) {
        __assert_fail("val->IsInt64()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                      ,0x4bd,
                      "FSerializer &Serialize(FSerializer &, const char *, int64_t &, int64_t *)");
      }
      *value = (int64_t)(pVVar4->data_).n;
    }
  }
  else {
    uVar1 = (pFVar2->mInObject).Count;
    if (uVar1 == 0) {
      cVar3 = '\0';
    }
    else {
      cVar3 = (pFVar2->mInObject).Array[uVar1 - 1];
    }
    if (((defval == (int64_t *)0x0) || (cVar3 == '\0')) || (*value != *defval)) {
      FSerializer::WriteKey(arc,key);
      FWriter::Int64(arc->w,*value);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, int64_t &value, int64_t *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			arc.WriteKey(key);
			arc.w->Int64(value);
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			assert(val->IsInt64());
			if (val->IsInt64())
			{
				value = val->GetInt64();
			}
			else
			{
				Printf(TEXTCOLOR_RED "integer type expected for '%s'", key);
				arc.mErrors++;
			}
		}
	}
	return arc;
}